

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastV32S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  char *pcVar5;
  ulong hasbits_00;
  ushort *puVar6;
  
  if (data.field_0._0_2_ != 0) {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  cVar1 = ptr[2];
  if (cVar1 < '\0') {
    pcVar5 = SingularVarBigint<unsigned_int,unsigned_short,false>
                       (msg,ptr + 2,ctx,data,table,hasbits_00);
    return pcVar5;
  }
  puVar6 = (ushort *)(ptr + 3);
  puVar3 = RefAt<unsigned_int>(msg,(ulong)data.field_0 >> 0x30);
  *puVar3 = (int)cVar1;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar6) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar3 = *puVar3 | (uint)hasbits_00;
    }
    return (char *)puVar6;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*puVar6;
  if ((uVar2 & 7) == 0) {
    uVar4 = (ulong)(uVar2 & 0xfffffff8);
    pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar6,ctx,
                                (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits_00);
    return pcVar5;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV32S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<uint32_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}